

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O1

void __thiscall
Js::WebAssemblySharedArrayBuffer::FreeBuffer
          (WebAssemblySharedArrayBuffer *this,BYTE *buffer,uint32 length,uint32 maxLength)

{
  code *pcVar1;
  char cVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  cVar2 = (**(code **)((long)(this->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.
                             super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject + 0x398))
                    (this,length);
  if (cVar2 != '\0') {
    Throw::FatalInternalError(-0x7fffbffb);
  }
  Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,buffer,(ulong)maxLength);
  if (maxLength < length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x286,"(maxLength >= length)","maxLength >= length");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (maxLength - length == 0) {
    return;
  }
  Memory::Recycler::ReportExternalMemoryFree
            (((((this->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.
                super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.type.ptr)->
              javascriptLibrary).ptr)->recycler,(ulong)(maxLength - length));
  return;
}

Assistant:

void WebAssemblySharedArrayBuffer::FreeBuffer(BYTE* buffer, uint32 length, uint32 maxLength)
    {
        if (IsValidVirtualBufferLength(length))
        {
            FreeMemAlloc(buffer);
        }
        else
        {
            HeapDeleteArray(maxLength, buffer);

            AssertOrFailFast(maxLength >= length);
            // JavascriptSharedArrayBuffer::Finalize will only report freeing `length`, we have to take care of the balance
            uint32 additionalSize = maxLength - length;
            if (additionalSize > 0)
            {
                Recycler* recycler = GetType()->GetLibrary()->GetRecycler();
                recycler->ReportExternalMemoryFree(additionalSize);
            }
        }
    }